

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPMPMultiplayer.cpp
# Opt level: O0

bool XPMP2::FindResFile(char *fName,string *outPath,bool bRequired)

{
  bool bVar1;
  undefined8 uVar2;
  byte in_DL;
  string *in_RSI;
  undefined8 in_RDI;
  string *in_stack_00000010;
  string path;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  string local_40 [39];
  byte local_19;
  string *local_18;
  undefined8 local_10;
  byte local_1;
  
  local_19 = in_DL & 1;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::operator+(in_stack_ffffffffffffffb8,
                 (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  bVar1 = ExistsFile(in_stack_00000010);
  if (bVar1) {
    std::__cxx11::string::operator=(local_18,local_40);
    local_1 = 1;
  }
  else {
    if (((local_19 & 1) != 0) && (glob < 5)) {
      uVar2 = std::__cxx11::string::c_str();
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/XPMPMultiplayer.cpp"
             ,0x35,"FindResFile",logFATAL,"File \'%s\' is missing in resource directory \'%s\'",
             local_10,uVar2);
    }
    local_1 = 0;
  }
  std::__cxx11::string::~string(local_40);
  return (bool)(local_1 & 1);
}

Assistant:

static bool FindResFile (const char* fName, std::string& outPath,
                         bool bRequired = true)
{
    std::string path = glob.resourceDir + fName;
    if (ExistsFile(path)) {
        outPath = std::move(path);
        return true;
    } else {
        if (bRequired) {
            LOG_MSG(logFATAL, ERR_RSRC_FILE_UNAVAIL,
                    fName, glob.resourceDir.c_str());
        }
        return false;
    }
}